

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathDebugDumpStepOp(FILE *output,xmlXPathCompExprPtr comp,xmlXPathStepOpPtr op,int depth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  xmlXPathObjectPtr cur;
  void *pvVar4;
  uint uVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  ulong __n;
  char shift [100];
  char local_98 [152];
  
  do {
    if (depth < 1) {
      __n = 0;
    }
    else {
      uVar5 = 0x18;
      if (depth - 1U < 0x18) {
        uVar5 = depth - 1U;
      }
      __n = (ulong)(uVar5 * 2 + 2);
      memset(local_98,0x20,__n);
    }
    (local_98 + __n)[0] = '\0';
    (local_98 + __n)[1] = '\0';
    fputs(local_98,(FILE *)output);
    if (op == (xmlXPathStepOpPtr)0x0) {
      fwrite("Step is NULL\n",0xd,1,(FILE *)output);
      return;
    }
    switch(op->op) {
    case XPATH_OP_END:
      pcVar7 = "END";
      goto LAB_001bc420;
    case XPATH_OP_AND:
      pcVar7 = "AND";
      goto LAB_001bc420;
    case XPATH_OP_OR:
      pcVar7 = "OR";
      sVar6 = 2;
      break;
    case XPATH_OP_EQUAL:
      if (op->value == 0) {
        pcVar7 = "EQUAL !=";
        goto LAB_001bc592;
      }
      pcVar7 = "EQUAL =";
      sVar6 = 7;
      break;
    case XPATH_OP_CMP:
      pcVar7 = "CMP <";
      if (op->value == 0) {
        pcVar7 = "CMP >";
      }
      fwrite(pcVar7,5,1,(FILE *)output);
      if (op->value2 == 0) {
        fputc(0x3d,(FILE *)output);
      }
      goto switchD_001bc453_default;
    case XPATH_OP_PLUS:
      switch(op->value) {
      case 0:
        pcVar7 = "PLUS -";
        goto LAB_001bc5bc;
      case 1:
        pcVar7 = "PLUS +";
LAB_001bc5bc:
        sVar6 = 6;
        break;
      case 2:
        pcVar7 = "PLUS unary -";
        sVar6 = 0xc;
        break;
      case 3:
        pcVar7 = "PLUS unary - -";
        sVar6 = 0xe;
        break;
      default:
        goto switchD_001bc453_default;
      }
      break;
    case XPATH_OP_MULT:
      if (op->value == 1) {
        pcVar7 = "MULT div";
      }
      else {
        if (op->value == 0) {
          pcVar7 = "MULT *";
          goto LAB_001bc5bc;
        }
        pcVar7 = "MULT mod";
      }
LAB_001bc592:
      sVar6 = 8;
      break;
    case XPATH_OP_UNION:
      pcVar7 = "UNION";
      sVar6 = 5;
      break;
    case XPATH_OP_ROOT:
      pcVar7 = "ROOT";
      goto LAB_001bc543;
    case XPATH_OP_NODE:
      pcVar7 = "NODE";
      goto LAB_001bc543;
    case XPATH_OP_COLLECT:
      iVar1 = op->value;
      iVar2 = op->value2;
      iVar3 = op->value3;
      pvVar4 = op->value4;
      pcVar7 = (char *)op->value5;
      fwrite("COLLECT ",8,1,(FILE *)output);
      switch(iVar1) {
      case 1:
        pcVar8 = " \'ancestors\' ";
        goto LAB_001bc6d1;
      case 2:
        pcVar8 = " \'ancestors-or-self\' ";
        goto LAB_001bc6a3;
      case 3:
        pcVar8 = " \'attributes\' ";
        goto LAB_001bc67e;
      case 4:
        pcVar8 = " \'child\' ";
        sVar6 = 9;
        break;
      case 5:
        pcVar8 = " \'descendant\' ";
LAB_001bc67e:
        sVar6 = 0xe;
        break;
      case 6:
        pcVar8 = " \'descendant-or-self\' ";
        goto LAB_001bc6b1;
      case 7:
        pcVar8 = " \'following\' ";
        goto LAB_001bc6d1;
      case 8:
        pcVar8 = " \'following-siblings\' ";
LAB_001bc6b1:
        sVar6 = 0x16;
        break;
      case 9:
        pcVar8 = " \'namespace\' ";
        goto LAB_001bc6d1;
      case 10:
        pcVar8 = " \'parent\' ";
        sVar6 = 10;
        break;
      case 0xb:
        pcVar8 = " \'preceding\' ";
LAB_001bc6d1:
        sVar6 = 0xd;
        break;
      case 0xc:
        pcVar8 = " \'preceding-sibling\' ";
LAB_001bc6a3:
        sVar6 = 0x15;
        break;
      case 0xd:
        pcVar8 = " \'self\' ";
        sVar6 = 8;
        break;
      default:
        goto code_r0x001bc6e8;
      }
      fwrite(pcVar8,sVar6,1,(FILE *)output);
code_r0x001bc6e8:
      switch(iVar2) {
      case 0:
        pcVar8 = "\'none\' ";
        goto LAB_001bc73d;
      case 1:
        pcVar8 = "\'type\' ";
        goto LAB_001bc73d;
      case 2:
        pcVar8 = "\'PI\' ";
        sVar6 = 5;
        break;
      case 3:
        pcVar8 = "\'all\' ";
        sVar6 = 6;
        break;
      case 4:
        pcVar8 = "\'namespace\' ";
        sVar6 = 0xc;
        break;
      case 5:
        pcVar8 = "\'name\' ";
LAB_001bc73d:
        sVar6 = 7;
        break;
      default:
        goto code_r0x001bc758;
      }
      fwrite(pcVar8,sVar6,1,(FILE *)output);
code_r0x001bc758:
      switch(iVar3) {
      case 0:
        pcVar8 = "\'node\' ";
        goto LAB_001bc788;
      default:
        goto switchD_001bc768_caseD_1;
      case 3:
        pcVar8 = "\'text\' ";
LAB_001bc788:
        sVar6 = 7;
        break;
      case 7:
        pcVar8 = "\'PI\' ";
        sVar6 = 5;
        break;
      case 8:
        pcVar8 = "\'comment\' ";
        sVar6 = 10;
      }
      fwrite(pcVar8,sVar6,1,(FILE *)output);
switchD_001bc768_caseD_1:
      if (pvVar4 != (void *)0x0) {
        fprintf((FILE *)output,"%s:");
      }
      if (pcVar7 != (char *)0x0) {
        fputs(pcVar7,(FILE *)output);
      }
      goto switchD_001bc453_default;
    case XPATH_OP_VALUE:
      cur = (xmlXPathObjectPtr)op->value4;
      fwrite("ELEM ",5,1,(FILE *)output);
      xmlXPathDebugDumpObject(output,cur,0);
      goto LAB_001bc5db;
    case XPATH_OP_VARIABLE:
      if (op->value5 == (void *)0x0) {
        fprintf((FILE *)output,"VARIABLE %s",op->value4);
      }
      else {
        fprintf((FILE *)output,"VARIABLE %s:%s");
      }
      goto switchD_001bc453_default;
    case XPATH_OP_FUNCTION:
      if (op->value5 == (void *)0x0) {
        fprintf((FILE *)output,"FUNCTION %s(%d args)",op->value4,(ulong)(uint)op->value);
      }
      else {
        fprintf((FILE *)output,"FUNCTION %s:%s(%d args)");
      }
      goto switchD_001bc453_default;
    case XPATH_OP_ARG:
      pcVar7 = "ARG";
LAB_001bc420:
      sVar6 = 3;
      break;
    case XPATH_OP_PREDICATE:
      pcVar7 = "PREDICATE";
      sVar6 = 9;
      break;
    case XPATH_OP_FILTER:
      pcVar7 = "FILTER";
      goto LAB_001bc5bc;
    case XPATH_OP_SORT:
      pcVar7 = "SORT";
LAB_001bc543:
      sVar6 = 4;
      break;
    default:
      fprintf((FILE *)output,"UNKNOWN %d\n");
      return;
    }
    fwrite(pcVar7,sVar6,1,(FILE *)output);
switchD_001bc453_default:
    fputc(10,(FILE *)output);
LAB_001bc5db:
    if (op->op == XPATH_OP_VALUE) {
      return;
    }
    if (-1 < (long)op->ch1) {
      xmlXPathDebugDumpStepOp(output,comp,comp->steps + op->ch1,depth + 1);
    }
    if ((long)op->ch2 < 0) {
      return;
    }
    op = comp->steps + op->ch2;
    depth = depth + 1;
  } while( true );
}

Assistant:

static void
xmlXPathDebugDumpStepOp(FILE *output, xmlXPathCompExprPtr comp,
	                     xmlXPathStepOpPtr op, int depth) {
    int i;
    char shift[100];

    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;

    fprintf(output, "%s", shift);
    if (op == NULL) {
	fprintf(output, "Step is NULL\n");
	return;
    }
    switch (op->op) {
        case XPATH_OP_END:
	    fprintf(output, "END"); break;
        case XPATH_OP_AND:
	    fprintf(output, "AND"); break;
        case XPATH_OP_OR:
	    fprintf(output, "OR"); break;
        case XPATH_OP_EQUAL:
	     if (op->value)
		 fprintf(output, "EQUAL =");
	     else
		 fprintf(output, "EQUAL !=");
	     break;
        case XPATH_OP_CMP:
	     if (op->value)
		 fprintf(output, "CMP <");
	     else
		 fprintf(output, "CMP >");
	     if (!op->value2)
		 fprintf(output, "=");
	     break;
        case XPATH_OP_PLUS:
	     if (op->value == 0)
		 fprintf(output, "PLUS -");
	     else if (op->value == 1)
		 fprintf(output, "PLUS +");
	     else if (op->value == 2)
		 fprintf(output, "PLUS unary -");
	     else if (op->value == 3)
		 fprintf(output, "PLUS unary - -");
	     break;
        case XPATH_OP_MULT:
	     if (op->value == 0)
		 fprintf(output, "MULT *");
	     else if (op->value == 1)
		 fprintf(output, "MULT div");
	     else
		 fprintf(output, "MULT mod");
	     break;
        case XPATH_OP_UNION:
	     fprintf(output, "UNION"); break;
        case XPATH_OP_ROOT:
	     fprintf(output, "ROOT"); break;
        case XPATH_OP_NODE:
	     fprintf(output, "NODE"); break;
        case XPATH_OP_SORT:
	     fprintf(output, "SORT"); break;
        case XPATH_OP_COLLECT: {
	    xmlXPathAxisVal axis = (xmlXPathAxisVal)op->value;
	    xmlXPathTestVal test = (xmlXPathTestVal)op->value2;
	    xmlXPathTypeVal type = (xmlXPathTypeVal)op->value3;
	    const xmlChar *prefix = op->value4;
	    const xmlChar *name = op->value5;

	    fprintf(output, "COLLECT ");
	    switch (axis) {
		case AXIS_ANCESTOR:
		    fprintf(output, " 'ancestors' "); break;
		case AXIS_ANCESTOR_OR_SELF:
		    fprintf(output, " 'ancestors-or-self' "); break;
		case AXIS_ATTRIBUTE:
		    fprintf(output, " 'attributes' "); break;
		case AXIS_CHILD:
		    fprintf(output, " 'child' "); break;
		case AXIS_DESCENDANT:
		    fprintf(output, " 'descendant' "); break;
		case AXIS_DESCENDANT_OR_SELF:
		    fprintf(output, " 'descendant-or-self' "); break;
		case AXIS_FOLLOWING:
		    fprintf(output, " 'following' "); break;
		case AXIS_FOLLOWING_SIBLING:
		    fprintf(output, " 'following-siblings' "); break;
		case AXIS_NAMESPACE:
		    fprintf(output, " 'namespace' "); break;
		case AXIS_PARENT:
		    fprintf(output, " 'parent' "); break;
		case AXIS_PRECEDING:
		    fprintf(output, " 'preceding' "); break;
		case AXIS_PRECEDING_SIBLING:
		    fprintf(output, " 'preceding-sibling' "); break;
		case AXIS_SELF:
		    fprintf(output, " 'self' "); break;
	    }
	    switch (test) {
                case NODE_TEST_NONE:
		    fprintf(output, "'none' "); break;
                case NODE_TEST_TYPE:
		    fprintf(output, "'type' "); break;
                case NODE_TEST_PI:
		    fprintf(output, "'PI' "); break;
                case NODE_TEST_ALL:
		    fprintf(output, "'all' "); break;
                case NODE_TEST_NS:
		    fprintf(output, "'namespace' "); break;
                case NODE_TEST_NAME:
		    fprintf(output, "'name' "); break;
	    }
	    switch (type) {
                case NODE_TYPE_NODE:
		    fprintf(output, "'node' "); break;
                case NODE_TYPE_COMMENT:
		    fprintf(output, "'comment' "); break;
                case NODE_TYPE_TEXT:
		    fprintf(output, "'text' "); break;
                case NODE_TYPE_PI:
		    fprintf(output, "'PI' "); break;
	    }
	    if (prefix != NULL)
		fprintf(output, "%s:", prefix);
	    if (name != NULL)
		fprintf(output, "%s", (const char *) name);
	    break;

        }
	case XPATH_OP_VALUE: {
	    xmlXPathObjectPtr object = (xmlXPathObjectPtr) op->value4;

	    fprintf(output, "ELEM ");
	    xmlXPathDebugDumpObject(output, object, 0);
	    goto finish;
	}
	case XPATH_OP_VARIABLE: {
	    const xmlChar *prefix = op->value5;
	    const xmlChar *name = op->value4;

	    if (prefix != NULL)
		fprintf(output, "VARIABLE %s:%s", prefix, name);
	    else
		fprintf(output, "VARIABLE %s", name);
	    break;
	}
	case XPATH_OP_FUNCTION: {
	    int nbargs = op->value;
	    const xmlChar *prefix = op->value5;
	    const xmlChar *name = op->value4;

	    if (prefix != NULL)
		fprintf(output, "FUNCTION %s:%s(%d args)",
			prefix, name, nbargs);
	    else
		fprintf(output, "FUNCTION %s(%d args)", name, nbargs);
	    break;
	}
        case XPATH_OP_ARG: fprintf(output, "ARG"); break;
        case XPATH_OP_PREDICATE: fprintf(output, "PREDICATE"); break;
        case XPATH_OP_FILTER: fprintf(output, "FILTER"); break;
	default:
        fprintf(output, "UNKNOWN %d\n", op->op); return;
    }
    fprintf(output, "\n");
finish:
    /* OP_VALUE has invalid ch1. */
    if (op->op == XPATH_OP_VALUE)
        return;

    if (op->ch1 >= 0)
	xmlXPathDebugDumpStepOp(output, comp, &comp->steps[op->ch1], depth + 1);
    if (op->ch2 >= 0)
	xmlXPathDebugDumpStepOp(output, comp, &comp->steps[op->ch2], depth + 1);
}